

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_detached(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  init_process_options("spawn_helper4",detach_failure_cb);
  options.flags._0_1_ = (byte)options.flags | 8;
  uVar3 = uv_default_loop();
  iVar1 = uv_spawn(uVar3,&process,&options);
  if (iVar1 == 0) {
    uv_unref(&process);
    uVar3 = uv_default_loop();
    iVar2 = uv_run(uVar3,0);
    iVar1 = process.pid;
    if (iVar2 != 0) goto LAB_001c1147;
    if (exit_cb_called != 0) goto LAB_001c1154;
    iVar2 = uv_process_get_pid(&process);
    if (iVar1 != iVar2) goto LAB_001c1161;
    iVar1 = uv_kill(process.pid,0);
    if (iVar1 != 0) goto LAB_001c116e;
    iVar1 = uv_kill(process.pid,0xf);
    if (iVar1 == 0) {
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c1188;
    }
  }
  else {
    run_test_spawn_detached_cold_1();
LAB_001c1147:
    run_test_spawn_detached_cold_2();
LAB_001c1154:
    run_test_spawn_detached_cold_3();
LAB_001c1161:
    run_test_spawn_detached_cold_4();
LAB_001c116e:
    run_test_spawn_detached_cold_5();
  }
  run_test_spawn_detached_cold_6();
LAB_001c1188:
  run_test_spawn_detached_cold_7();
  puts("detach_cb");
  exit_cb_called = exit_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_detached) {
  int r;

  init_process_options("spawn_helper4", detach_failure_cb);

  options.flags |= UV_PROCESS_DETACHED;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  uv_unref((uv_handle_t*) &process);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_OK(exit_cb_called);

  ASSERT_EQ(process.pid, uv_process_get_pid(&process));

  r = uv_kill(process.pid, 0);
  ASSERT_OK(r);

  r = uv_kill(process.pid, SIGTERM);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}